

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall OtherHashAlgAndValue::SetDataSize(OtherHashAlgAndValue *this)

{
  size_t sVar1;
  size_t sVar2;
  OtherHashAlgAndValue *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->hashAlgorithm).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->hashValue).super_DerBase);
  (this->super_DerBase).cbData = sVar1 + sVar2;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = hashAlgorithm.EncodedSize() + hashValue.EncodedSize();
		return cbData;
	}